

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::DG2Dot
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *dg,uint32_t opts,char *file)

{
  set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
  *in_RCX;
  uint32_t in_EDX;
  DependenceGraph<dg::LLVMNode> *in_RSI;
  DG2Dot<dg::LLVMNode> *in_RDI;
  char *in_stack_ffffffffffffffb8;
  
  in_RDI->_vptr_DG2Dot = (_func_int **)&PTR_printKey_001fdba8;
  std::
  set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
  ::set((set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
         *)0x1c7ef8);
  std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::set
            ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
             0x1c7f06);
  in_RDI->options = in_EDX;
  in_RDI->dd_color = "cyan4";
  in_RDI->use_color = "black";
  in_RDI->cd_color = "blue";
  in_RDI->cfg_color = "gray";
  in_RDI->dg = in_RSI;
  in_RDI->file = (char *)in_RCX;
  std::
  set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
  ::set((set<dg::DependenceGraph<dg::LLVMNode>_*,_std::less<dg::DependenceGraph<dg::LLVMNode>_*>,_std::allocator<dg::DependenceGraph<dg::LLVMNode>_*>_>
         *)0x1c7f68);
  std::ofstream::ofstream(&in_RDI->out);
  std::
  set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
  ::insert(in_RCX,(value_type *)0x0);
  reopen(in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

DG2Dot<NodeT>(DependenceGraph<NodeT> *dg,
                  uint32_t opts = PRINT_CFG | PRINT_DD | PRINT_CD | PRINT_USE,
                  const char *file = nullptr)
            : options(opts), dg(dg), file(file) {
        // if a graph has no global nodes, this will forbid trying to print them
        dumpedGlobals.insert(nullptr);
        reopen(file);
    }